

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O0

void RandAddDynamicEnv(CSHA512 *hasher)

{
  int iVar1;
  void *__ptr;
  CSHA512 *in_RDI;
  long in_FS_OFFSET;
  void *addr;
  rusage usage;
  timeval tv;
  timespec ts;
  CSHA512 *in_stack_fffffffffffffec8;
  timespec *in_stack_fffffffffffffed0;
  CSHA512 *data;
  CSHA512 *in_stack_fffffffffffffed8;
  CSHA512 *hasher_00;
  rusage local_100;
  undefined8 local_70;
  rep local_68;
  rep local_60;
  undefined8 local_58;
  rep local_50;
  rep local_48;
  undefined8 local_40;
  rep local_38;
  rep local_30;
  timeval local_28;
  timespec local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown.dwarf_1e255a7::RandAddSeedPerfmon(in_stack_fffffffffffffec8);
  memset(&local_18,0,0x10);
  clock_gettime(1,&local_18);
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  clock_gettime(0,&local_18);
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  clock_gettime(7,&local_18);
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  memset(&local_28,0,0x10);
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffed8,(timeval *)in_stack_fffffffffffffed0);
  data = in_RDI;
  local_40 = std::chrono::_V2::system_clock::now();
  local_38 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)data);
  local_30 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                       ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffec8);
  (anonymous_namespace)::operator<<(in_stack_fffffffffffffed8,(long *)data);
  hasher_00 = in_RDI;
  local_58 = std::chrono::_V2::steady_clock::now();
  local_50 = (rep)std::chrono::
                  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)data);
  local_48 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                       ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffec8);
  (anonymous_namespace)::operator<<(hasher_00,(long *)data);
  local_70 = std::chrono::_V2::system_clock::now();
  local_68 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)data);
  local_60 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                       ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffec8);
  (anonymous_namespace)::operator<<(hasher_00,(long *)data);
  memset(&local_100,0,0x90);
  iVar1 = getrusage(RUSAGE_SELF,&local_100);
  if (iVar1 == 0) {
    (anonymous_namespace)::operator<<(hasher_00,(rusage *)data);
  }
  anon_unknown.dwarf_1e255a7::AddFile(in_RDI,"/proc/diskstats");
  anon_unknown.dwarf_1e255a7::AddFile(in_RDI,"/proc/vmstat");
  anon_unknown.dwarf_1e255a7::AddFile(in_RDI,"/proc/schedstat");
  anon_unknown.dwarf_1e255a7::AddFile(in_RDI,"/proc/zoneinfo");
  anon_unknown.dwarf_1e255a7::AddFile(in_RDI,"/proc/meminfo");
  anon_unknown.dwarf_1e255a7::AddFile(in_RDI,"/proc/softirqs");
  anon_unknown.dwarf_1e255a7::AddFile(in_RDI,"/proc/stat");
  anon_unknown.dwarf_1e255a7::AddFile(in_RDI,"/proc/self/schedstat");
  anon_unknown.dwarf_1e255a7::AddFile(in_RDI,"/proc/self/status");
  __ptr = malloc(0x1001);
  (anonymous_namespace)::operator<<(hasher_00,(void ***)data);
  (anonymous_namespace)::operator<<(hasher_00,(void **)data);
  free(__ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RandAddDynamicEnv(CSHA512& hasher)
{
    RandAddSeedPerfmon(hasher);

    // Various clocks
#ifdef WIN32
    FILETIME ftime;
    GetSystemTimeAsFileTime(&ftime);
    hasher << ftime;
#else
    struct timespec ts = {};
#    ifdef CLOCK_MONOTONIC
    clock_gettime(CLOCK_MONOTONIC, &ts);
    hasher << ts;
#    endif
#    ifdef CLOCK_REALTIME
    clock_gettime(CLOCK_REALTIME, &ts);
    hasher << ts;
#    endif
#    ifdef CLOCK_BOOTTIME
    clock_gettime(CLOCK_BOOTTIME, &ts);
    hasher << ts;
#    endif
    // gettimeofday is available on all UNIX systems, but only has microsecond precision.
    struct timeval tv = {};
    gettimeofday(&tv, nullptr);
    hasher << tv;
#endif
    // Probably redundant, but also use all the standard library clocks:
    hasher << std::chrono::system_clock::now().time_since_epoch().count();
    hasher << std::chrono::steady_clock::now().time_since_epoch().count();
    hasher << std::chrono::high_resolution_clock::now().time_since_epoch().count();

#ifndef WIN32
    // Current resource usage.
    struct rusage usage = {};
    if (getrusage(RUSAGE_SELF, &usage) == 0) hasher << usage;
#endif

#ifdef __linux__
    AddFile(hasher, "/proc/diskstats");
    AddFile(hasher, "/proc/vmstat");
    AddFile(hasher, "/proc/schedstat");
    AddFile(hasher, "/proc/zoneinfo");
    AddFile(hasher, "/proc/meminfo");
    AddFile(hasher, "/proc/softirqs");
    AddFile(hasher, "/proc/stat");
    AddFile(hasher, "/proc/self/schedstat");
    AddFile(hasher, "/proc/self/status");
#endif

#ifdef HAVE_SYSCTL
#  ifdef CTL_KERN
#    if defined(KERN_PROC) && defined(KERN_PROC_ALL)
    AddSysctl<CTL_KERN, KERN_PROC, KERN_PROC_ALL>(hasher);
#    endif
#  endif
#  ifdef CTL_HW
#    ifdef HW_DISKSTATS
    AddSysctl<CTL_HW, HW_DISKSTATS>(hasher);
#    endif
#  endif
#  ifdef CTL_VM
#    ifdef VM_LOADAVG
    AddSysctl<CTL_VM, VM_LOADAVG>(hasher);
#    endif
#    ifdef VM_TOTAL
    AddSysctl<CTL_VM, VM_TOTAL>(hasher);
#    endif
#    ifdef VM_METER
    AddSysctl<CTL_VM, VM_METER>(hasher);
#    endif
#  endif
#endif

    // Stack and heap location
    void* addr = malloc(4097);
    hasher << &addr << addr;
    free(addr);
}